

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDF_linearization.cc
# Opt level: O2

void __thiscall QPDF::readHSharedObject(QPDF *this,BitStream h)

{
  _Head_base<0UL,_QPDF::Members_*,_false> _Var1;
  pointer pHVar2;
  vector<QPDF::HSharedObjectEntry,_std::allocator<QPDF::HSharedObjectEntry>_> *vec;
  int iVar3;
  int bits_wanted;
  unsigned_long uVar4;
  reference pvVar5;
  size_t i;
  ulong __n;
  bool bVar6;
  int nitems;
  Members *local_38;
  
  _Var1._M_head_impl =
       (this->m)._M_t.super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>._M_t
       .super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>.
       super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl;
  iVar3 = BitStream::getBitsInt(&h,0x20);
  ((_Var1._M_head_impl)->shared_object_hints).first_shared_obj = iVar3;
  iVar3 = BitStream::getBitsInt(&h,0x20);
  *(long *)((long)&(_Var1._M_head_impl)->shared_object_hints + 8) = (long)iVar3;
  iVar3 = BitStream::getBitsInt(&h,0x20);
  *(int *)((long)&(_Var1._M_head_impl)->shared_object_hints + 0x10) = iVar3;
  iVar3 = BitStream::getBitsInt(&h,0x20);
  *(int *)((long)&(_Var1._M_head_impl)->shared_object_hints + 0x14) = iVar3;
  iVar3 = BitStream::getBitsInt(&h,0x10);
  *(int *)((long)&(_Var1._M_head_impl)->shared_object_hints + 0x18) = iVar3;
  iVar3 = BitStream::getBitsInt(&h,0x20);
  *(int *)((long)&(_Var1._M_head_impl)->shared_object_hints + 0x1c) = iVar3;
  bits_wanted = BitStream::getBitsInt(&h,0x10);
  *(int *)((long)&(_Var1._M_head_impl)->shared_object_hints + 0x20) = bits_wanted;
  iVar3 = *(int *)((long)&(_Var1._M_head_impl)->shared_object_hints + 0x14);
  vec = (vector<QPDF::HSharedObjectEntry,_std::allocator<QPDF::HSharedObjectEntry>_> *)
        ((long)&(_Var1._M_head_impl)->shared_object_hints + 0x28);
  pHVar2 = *(pointer *)
            &((vector<QPDF::HSharedObjectEntry,_std::allocator<QPDF::HSharedObjectEntry>_> *)
             ((long)&(_Var1._M_head_impl)->shared_object_hints + 0x28))->
             super__Vector_base<QPDF::HSharedObjectEntry,_std::allocator<QPDF::HSharedObjectEntry>_>
  ;
  if (*(pointer *)((long)&(_Var1._M_head_impl)->shared_object_hints + 0x30) != pHVar2) {
    *(pointer *)((long)&(_Var1._M_head_impl)->shared_object_hints + 0x30) = pHVar2;
  }
  __n = 0;
  nitems = iVar3;
  local_38 = _Var1._M_head_impl;
  load_vector_int<QPDF::HSharedObjectEntry,int>(&h,iVar3,vec,bits_wanted,0);
  load_vector_int<QPDF::HSharedObjectEntry,int>(&h,iVar3,vec,1,4);
  while( true ) {
    uVar4 = QIntC::IntConverter<int,_unsigned_long,_true,_false>::convert(&nitems);
    if (uVar4 <= __n) break;
    pvVar5 = std::vector<QPDF::HSharedObjectEntry,_std::allocator<QPDF::HSharedObjectEntry>_>::at
                       (vec,__n);
    if (pvVar5->signature_present != 0) {
      iVar3 = 4;
      while (bVar6 = iVar3 != 0, iVar3 = iVar3 + -1, bVar6) {
        BitStream::getBits(&h,0x20);
      }
    }
    __n = __n + 1;
  }
  load_vector_int<QPDF::HSharedObjectEntry,int>
            (&h,nitems,vec,(local_38->shared_object_hints).nbits_nobjects,8);
  return;
}

Assistant:

void
QPDF::readHSharedObject(BitStream h)
{
    HSharedObject& t = m->shared_object_hints;

    t.first_shared_obj = h.getBitsInt(32);         // 1
    t.first_shared_offset = h.getBitsInt(32);      // 2
    t.nshared_first_page = h.getBitsInt(32);       // 3
    t.nshared_total = h.getBitsInt(32);            // 4
    t.nbits_nobjects = h.getBitsInt(16);           // 5
    t.min_group_length = h.getBitsInt(32);         // 6
    t.nbits_delta_group_length = h.getBitsInt(16); // 7

    QTC::TC(
        "qpdf",
        "QPDF lin nshared_total > nshared_first_page",
        (t.nshared_total > t.nshared_first_page) ? 1 : 0);

    std::vector<HSharedObjectEntry>& entries = t.entries;
    entries.clear();
    int nitems = t.nshared_total;
    load_vector_int(
        h, nitems, entries, t.nbits_delta_group_length, &HSharedObjectEntry::delta_group_length);
    load_vector_int(h, nitems, entries, 1, &HSharedObjectEntry::signature_present);
    for (size_t i = 0; i < toS(nitems); ++i) {
        if (entries.at(i).signature_present) {
            // Skip 128-bit MD5 hash.  These are not supported by acrobat, so they should probably
            // never be there.  We have no test case for this.
            for (int j = 0; j < 4; ++j) {
                (void)h.getBits(32);
            }
        }
    }
    load_vector_int(h, nitems, entries, t.nbits_nobjects, &HSharedObjectEntry::nobjects_minus_one);
}